

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

VkColorComponentFlags Diligent::ColorMaskToVkColorComponentFlags(COLOR_MASK ColorMask)

{
  return ColorMask & 0xf;
}

Assistant:

VkColorComponentFlags ColorMaskToVkColorComponentFlags(COLOR_MASK ColorMask)
{
    VkColorComponentFlags Flags = 0;
    if (ColorMask & COLOR_MASK_RED)
        Flags |= VK_COLOR_COMPONENT_R_BIT;
    if (ColorMask & COLOR_MASK_GREEN)
        Flags |= VK_COLOR_COMPONENT_G_BIT;
    if (ColorMask & COLOR_MASK_BLUE)
        Flags |= VK_COLOR_COMPONENT_B_BIT;
    if (ColorMask & COLOR_MASK_ALPHA)
        Flags |= VK_COLOR_COMPONENT_A_BIT;
    return Flags;
}